

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

_Bool alloc_tensor_range(ggml_context *ctx,ggml_tensor *first,ggml_tensor *last,
                        ggml_backend_buffer_type_t buft,size_t size,ggml_backend_buffer_t **buffers,
                        size_t *n_buffers)

{
  long lVar1;
  long lVar2;
  ggml_backend_buffer_t pgVar3;
  char *pcVar4;
  void *pvVar5;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_context *in_RDI;
  undefined8 in_R8;
  long *in_R9;
  long *in_stack_00000008;
  ggml_status status;
  ggml_tensor *t;
  ggml_tallocr tallocr;
  ggml_backend_buffer_t buffer;
  size_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ggml_status gVar6;
  ggml_tensor *local_68;
  ggml_backend_buffer_t in_stack_ffffffffffffffa0;
  ggml_tensor *in_stack_ffffffffffffffa8;
  ggml_tallocr *in_stack_ffffffffffffffb0;
  _Bool local_1;
  
  pgVar3 = ggml_backend_buft_alloc_buffer
                     ((ggml_backend_buffer_type_t)tallocr.alignment,(size_t)tallocr.base);
  if (pgVar3 == (ggml_backend_buffer_t)0x0) {
    pcVar4 = ggml_backend_buft_name((ggml_backend_buffer_type_t)0x15c950);
    ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %s buffer of size %zu\n",
                      "alloc_tensor_range",pcVar4,in_R8);
    free_buffers((ggml_backend_buffer_t **)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
    local_1 = false;
  }
  else {
    pvVar5 = realloc((void *)*in_R9,(*in_stack_00000008 + 1) * 8);
    *in_R9 = (long)pvVar5;
    lVar1 = *in_R9;
    lVar2 = *in_stack_00000008;
    *in_stack_00000008 = lVar2 + 1;
    *(ggml_backend_buffer_t *)(lVar1 + lVar2 * 8) = pgVar3;
    ggml_tallocr_new(in_stack_ffffffffffffffa0);
    for (local_68 = in_RSI; local_68 != in_RDX; local_68 = ggml_get_next_tensor(in_RDI,local_68)) {
      gVar6 = GGML_STATUS_SUCCESS;
      if (local_68->data == (void *)0x0) {
        if (local_68->view_src == (ggml_tensor *)0x0) {
          gVar6 = ggml_tallocr_alloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        }
        else if (local_68->buffer == (ggml_backend_buffer *)0x0) {
          gVar6 = ggml_backend_view_init((ggml_tensor *)0x15ca59);
        }
      }
      else if ((local_68->view_src != (ggml_tensor *)0x0) &&
              (local_68->buffer == (ggml_backend_buffer *)0x0)) {
        gVar6 = ggml_backend_view_init((ggml_tensor *)0x15ca86);
      }
      if (gVar6 != GGML_STATUS_SUCCESS) {
        ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to initialize tensor %s\n",
                          "alloc_tensor_range",local_68->name);
        free_buffers((ggml_backend_buffer_t **)CONCAT44(gVar6,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool alloc_tensor_range(struct ggml_context * ctx,
        struct ggml_tensor * first, struct ggml_tensor * last,
        ggml_backend_buffer_type_t buft, size_t size,
        ggml_backend_buffer_t ** buffers, size_t * n_buffers) {

    ggml_backend_buffer_t buffer = ggml_backend_buft_alloc_buffer(buft, size);
    if (buffer == NULL) {
        GGML_LOG_ERROR("%s: failed to allocate %s buffer of size %zu\n", __func__, ggml_backend_buft_name(buft), size);
        free_buffers(buffers, n_buffers);
        return false;
    }

    *buffers = realloc(*buffers, sizeof(ggml_backend_buffer_t) * (*n_buffers + 1));
    (*buffers)[(*n_buffers)++] = buffer;

    struct ggml_tallocr tallocr = ggml_tallocr_new(buffer);

    for (struct ggml_tensor * t = first; t != last; t = ggml_get_next_tensor(ctx, t)) {
        enum ggml_status status = GGML_STATUS_SUCCESS;
        if (t->data == NULL) {
            if (t->view_src == NULL) {
                status = ggml_tallocr_alloc(&tallocr, t);
            } else if (t->buffer == NULL) {
                status = ggml_backend_view_init(t);
            }
        } else {
            if (t->view_src != NULL && t->buffer == NULL) {
                // view of a pre-allocated tensor
                status = ggml_backend_view_init(t);
            }
        }
        if (status != GGML_STATUS_SUCCESS) {
            GGML_LOG_ERROR("%s: failed to initialize tensor %s\n", __func__, t->name);
            free_buffers(buffers, n_buffers);
            return false;
        }
    }

    return true;
}